

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort_state.cpp
# Opt level: O2

void __thiscall
duckdb::LocalSortState::Initialize
          (LocalSortState *this,GlobalSortState *global_sort_state,BufferManager *buffer_manager_p)

{
  pointer pRVar1;
  int iVar2;
  undefined4 extraout_var;
  idx_t payload_row_width;
  idx_t entries_per_block;
  idx_t block_size;
  bool local_49;
  pointer local_48;
  uint local_3c;
  pointer local_38;
  ulong local_30;
  ulong local_28;
  ulong uVar3;
  
  this->sort_layout = &global_sort_state->sort_layout;
  this->payload_layout = &global_sort_state->payload_layout;
  this->buffer_manager = buffer_manager_p;
  iVar2 = (*buffer_manager_p->_vptr_BufferManager[0xf])(buffer_manager_p);
  uVar3 = CONCAT44(extraout_var,iVar2);
  local_30 = uVar3 / this->sort_layout->entry_size;
  local_28 = uVar3;
  make_uniq<duckdb::RowDataCollection,duckdb::BufferManager&,unsigned_long&,unsigned_long_const&>
            ((duckdb *)&local_38,this->buffer_manager,&local_30,&this->sort_layout->entry_size);
  pRVar1 = local_38;
  local_38 = (pointer)0x0;
  ::std::__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
  ::reset((__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
           *)&this->radix_sorting_data,pRVar1);
  ::std::unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>::
  ~unique_ptr((unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
               *)&local_38);
  if (this->sort_layout->all_constant == false) {
    local_38 = (pointer)(this->sort_layout->blob_layout).row_width;
    local_30 = uVar3 / (ulong)local_38;
    make_uniq<duckdb::RowDataCollection,duckdb::BufferManager&,unsigned_long&,unsigned_long&>
              ((duckdb *)&local_48,this->buffer_manager,&local_30,(unsigned_long *)&local_38);
    pRVar1 = local_48;
    local_48 = (pointer)0x0;
    ::std::
    __uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>::
    reset((__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
           *)&this->blob_sorting_data,pRVar1);
    ::std::unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>::
    ~unique_ptr((unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                 *)&local_48);
    local_3c = 1;
    local_49 = true;
    make_uniq<duckdb::RowDataCollection,duckdb::BufferManager&,unsigned_long_const&,unsigned_int,bool>
              ((duckdb *)&local_48,this->buffer_manager,&local_28,&local_3c,&local_49);
    pRVar1 = local_48;
    local_48 = (pointer)0x0;
    ::std::
    __uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>::
    reset((__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
           *)&this->blob_sorting_heap,pRVar1);
    ::std::unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>::
    ~unique_ptr((unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
                 *)&local_48);
    uVar3 = local_28;
  }
  local_38 = (pointer)this->payload_layout->row_width;
  local_30 = uVar3 / (ulong)local_38;
  make_uniq<duckdb::RowDataCollection,duckdb::BufferManager&,unsigned_long&,unsigned_long&>
            ((duckdb *)&local_48,this->buffer_manager,&local_30,(unsigned_long *)&local_38);
  pRVar1 = local_48;
  local_48 = (pointer)0x0;
  ::std::__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
  ::reset((__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
           *)&this->payload_data,pRVar1);
  ::std::unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>::
  ~unique_ptr((unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
               *)&local_48);
  local_3c = 1;
  local_49 = true;
  make_uniq<duckdb::RowDataCollection,duckdb::BufferManager&,unsigned_long_const&,unsigned_int,bool>
            ((duckdb *)&local_48,this->buffer_manager,&local_28,&local_3c,&local_49);
  pRVar1 = local_48;
  local_48 = (pointer)0x0;
  ::std::__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
  ::reset((__uniq_ptr_impl<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
           *)&this->payload_heap,pRVar1);
  ::std::unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>::
  ~unique_ptr((unique_ptr<duckdb::RowDataCollection,_std::default_delete<duckdb::RowDataCollection>_>
               *)&local_48);
  this->initialized = true;
  return;
}

Assistant:

void LocalSortState::Initialize(GlobalSortState &global_sort_state, BufferManager &buffer_manager_p) {
	sort_layout = &global_sort_state.sort_layout;
	payload_layout = &global_sort_state.payload_layout;
	buffer_manager = &buffer_manager_p;
	const auto block_size = buffer_manager->GetBlockSize();

	// Radix sorting data
	auto entries_per_block = RowDataCollection::EntriesPerBlock(sort_layout->entry_size, block_size);
	radix_sorting_data = make_uniq<RowDataCollection>(*buffer_manager, entries_per_block, sort_layout->entry_size);

	// Blob sorting data
	if (!sort_layout->all_constant) {
		auto blob_row_width = sort_layout->blob_layout.GetRowWidth();
		entries_per_block = RowDataCollection::EntriesPerBlock(blob_row_width, block_size);
		blob_sorting_data = make_uniq<RowDataCollection>(*buffer_manager, entries_per_block, blob_row_width);
		blob_sorting_heap = make_uniq<RowDataCollection>(*buffer_manager, block_size, 1U, true);
	}

	// Payload data
	auto payload_row_width = payload_layout->GetRowWidth();
	entries_per_block = RowDataCollection::EntriesPerBlock(payload_row_width, block_size);
	payload_data = make_uniq<RowDataCollection>(*buffer_manager, entries_per_block, payload_row_width);
	payload_heap = make_uniq<RowDataCollection>(*buffer_manager, block_size, 1U, true);
	initialized = true;
}